

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,false,false>>>
::
reorder<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>>
          (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,false,false>>>
           *this,unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 *valueMap,Index columnIndex)

{
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,false,false>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,false,false>>::Matrix_column_tag,1u>,unsigned_long,false,void>
  *plVar1;
  Matrix_entry *entry;
  ID_index rowIndex;
  undefined8 in_RAX;
  mapped_type *pmVar2;
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,false,false>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,false,false>>::Matrix_column_tag,1u>,unsigned_long,false,void>
  *plVar3;
  undefined8 uStack_38;
  
  plVar1 = (list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,false,false>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,false,false>>::Matrix_column_tag,1u>,unsigned_long,false,void>
            *)(this + 0x28);
  plVar3 = plVar1;
  uStack_38 = in_RAX;
  while (plVar3 = *(list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,false,false>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,false,false>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                    **)plVar3, plVar3 != plVar1) {
    entry = (Matrix_entry *)(plVar3 + -0x18);
    Row_access<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>_>
    ::unlink((Row_access<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>_>
              *)this,(char *)entry);
    if (columnIndex != 0xffffffff) {
      (entry->super_Entry_column_index_option).columnIndex_ = columnIndex;
    }
    uStack_38 = CONCAT44(*(undefined4 *)(plVar3 + 0x10),(undefined4)uStack_38);
    pmVar2 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)valueMap,(key_type *)((long)&uStack_38 + 4));
    rowIndex = *pmVar2;
    *(ID_index *)(plVar3 + 0x10) = rowIndex;
    Row_access<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>_>
    ::insert_entry((Row_access<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_false,_false>_>_>
                    *)this,rowIndex,entry);
  }
  boost::intrusive::
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,false,false>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,false,false>>::Matrix_column_tag,1u>,unsigned_long,false,void>
  ::
  sort<std::less<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,false,false>>>>>
            (plVar1);
  return;
}

Assistant:

inline void Intrusive_list_column<Master_matrix>::reorder(const Row_index_map& valueMap,
                                                          [[maybe_unused]] Index columnIndex)
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Method not available for chain columns.");

  for (auto it = column_.begin(); it != column_.end(); ++it) {
    Entry* entry = &(*it);
    if constexpr (Master_matrix::Option_list::has_row_access) {
      RA_opt::unlink(entry);
      if (columnIndex != Master_matrix::template get_null_value<Index>()) entry->set_column_index(columnIndex);
    }
    entry->set_row_index(valueMap.at(entry->get_row_index()));
    if constexpr (Master_matrix::Option_list::has_intrusive_rows && Master_matrix::Option_list::has_row_access)
      RA_opt::insert_entry(entry->get_row_index(), entry);
  }

  // all entries have to be deleted first, to avoid problem with insertion when row is a set
  if constexpr (!Master_matrix::Option_list::has_intrusive_rows && Master_matrix::Option_list::has_row_access) {
    for (auto it = column_.begin(); it != column_.end(); ++it) {
      Entry* entry = &(*it);
      RA_opt::insert_entry(entry->get_row_index(), entry);
    }
  }

  column_.sort();
}